

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O0

wstring * ON_UTF_WideChar_to_std_wstring_abi_cxx11_
                    (wstring *__return_storage_ptr__,int bTestByteOrder,wchar_t *sInputUTF,
                    int sInputUTF_count,uint *error_status,uint error_mask,
                    ON__UINT32 error_code_point,int *end_element_index)

{
  wstring local_60;
  wchar_t *local_40;
  wchar_t *sEndElement;
  uint *puStack_30;
  uint error_mask_local;
  uint *error_status_local;
  wchar_t *pwStack_20;
  int sInputUTF_count_local;
  wchar_t *sInputUTF_local;
  wstring *pwStack_10;
  int bTestByteOrder_local;
  wstring *str;
  
  sEndElement._3_1_ = 0;
  sEndElement._4_4_ = error_mask;
  puStack_30 = error_status;
  error_status_local._4_4_ = sInputUTF_count;
  pwStack_20 = sInputUTF;
  sInputUTF_local._4_4_ = bTestByteOrder;
  pwStack_10 = __return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  local_40 = pwStack_20;
  ON_UTF32_to_std_wstring_abi_cxx11_
            (&local_60,sInputUTF_local._4_4_,(ON__UINT32 *)pwStack_20,error_status_local._4_4_,
             puStack_30,sEndElement._4_4_,error_code_point,(ON__UINT32 **)&local_40);
  std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  if (end_element_index != (int *)0x0) {
    *end_element_index = (int)((long)local_40 - (long)pwStack_20 >> 2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring ON_UTF_WideChar_to_std_wstring(
  int bTestByteOrder,
  const wchar_t* sInputUTF,
  int sInputUTF_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  int* end_element_index
  ) ON_NOEXCEPT
{
  std::wstring str;
  const wchar_t* sEndElement = sInputUTF;

  switch(sizeof(wchar_t))
  {
  case sizeof(char):
    str = ON_UTF8_to_std_wstring(
      bTestByteOrder,
      (const char*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const char**)&sEndElement
      );
    break;

  case sizeof(ON__UINT16):
    str = ON_UTF16_to_std_wstring(
      bTestByteOrder,
      (const ON__UINT16*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const ON__UINT16**)&sEndElement
      );
    break;

  case sizeof(ON__UINT32):
    str = ON_UTF32_to_std_wstring(
      bTestByteOrder,
      (const ON__UINT32*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const ON__UINT32**)&sEndElement
      );
    break;

  default:
    if ( 0 != error_status )
      *error_status = 1;
    break;
  }

  if ( 0 != end_element_index )
    *end_element_index = static_cast<int>(sEndElement - sInputUTF);

  return str;
}